

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::CanonicalizePath_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view path)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view s;
  bool bVar1;
  const_reference pvVar2;
  reference_conflict pvVar3;
  char *in_R8;
  string_view separator;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  size_t local_120;
  char *local_118;
  undefined1 local_110 [8];
  string_view part;
  const_iterator __end2;
  const_iterator __begin2;
  ConvertibleToStringView local_88;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  canonical_parts;
  string_view path_local;
  
  canonical_parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_38);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &canonical_parts.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((!bVar1) &&
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &canonical_parts.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), *pvVar2 == '/')) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,anon_var_dwarf_37cdd0 + 5);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_38,&local_48);
  }
  s._M_str = (char *)path._M_len;
  s._M_len = (size_t)canonical_parts.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_88,s);
  absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
            (&local_78,(lts_20250127 *)local_88.value_._M_len,local_88.value_._M_str,0x2f);
  local_60 = &local_78;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)&__end2.delimiter_,local_60);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end((const_iterator *)&part._M_str,local_60);
  while (bVar1 = absl::lts_20250127::strings_internal::operator!=
                           ((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&__end2.delimiter_,
                            (SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&part._M_str), bVar1) {
    pvVar3 = absl::lts_20250127::strings_internal::
             SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator*((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&__end2.delimiter_);
    local_120 = pvVar3->_M_len;
    local_118 = pvVar3->_M_str;
    local_110 = (undefined1  [8])local_120;
    part._M_len = (size_t)local_118;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,".");
    __x._M_str = local_118;
    __x._M_len = local_120;
    bVar1 = std::operator==(__x,local_130);
    if (!bVar1) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_38,(value_type *)local_110);
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__end2.delimiter_);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &canonical_parts.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((!bVar1) &&
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &canonical_parts.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), *pvVar2 == '/')) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_140,anon_var_dwarf_37cdd0 + 5);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_38,&local_140);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"/");
  separator._M_str = in_R8;
  separator._M_len = (size_t)local_150._M_str;
  absl::lts_20250127::
  StrJoin<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (__return_storage_ptr__,(lts_20250127 *)local_38,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_150._M_len,separator);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string CanonicalizePath(absl::string_view path) {
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter even though
  // backslashes are standard.  Let's avoid confusion and use only forward
  // slashes.
  std::string path_str;
  if (absl::StartsWith(path, "\\\\")) {
    // Avoid converting two leading backslashes.
    path_str = absl::StrCat("\\\\",
                            absl::StrReplaceAll(path.substr(2), {{"\\", "/"}}));
  } else {
    path_str = absl::StrReplaceAll(path, {{"\\", "/"}});
  }
  path = path_str;
#endif

  std::vector<absl::string_view> canonical_parts;
  if (!path.empty() && path.front() == '/') canonical_parts.push_back("");
  for (absl::string_view part : absl::StrSplit(path, '/', absl::SkipEmpty())) {
    if (part == ".") {
      // Ignore.
    } else {
      canonical_parts.push_back(part);
    }
  }
  if (!path.empty() && path.back() == '/') canonical_parts.push_back("");

  return absl::StrJoin(canonical_parts, "/");
}